

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sim.cc
# Opt level: O2

void __thiscall sim_array_access_Test::TestBody(sim_array_access_Test *this)

{
  int iVar1;
  Generator *this_00;
  Var *pVVar2;
  Var *var;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar3;
  char *in_R9;
  optional<unsigned_long> value_00;
  optional<unsigned_long> oVar4;
  undefined1 local_340 [8];
  Context context;
  Simulator sim;
  AssertHelper local_68;
  Message local_60;
  AssertionResult gtest_ar_;
  undefined1 auStack_48 [4];
  uint32_t value;
  AssertionResult gtest_ar;
  AssertHelper local_28;
  
  kratos::Context::Context((Context *)local_340);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&context.tracked_generators_._M_h._M_single_bucket,"mod",
             (allocator<char> *)auStack_48);
  this_00 = kratos::Context::generator
                      ((Context *)local_340,
                       (string *)&context.tracked_generators_._M_h._M_single_bucket);
  std::__cxx11::string::~string((string *)&context.tracked_generators_._M_h._M_single_bucket);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&context.tracked_generators_._M_h._M_single_bucket,"a",
             (allocator<char> *)auStack_48);
  pVVar2 = kratos::Generator::var
                     (this_00,(string *)&context.tracked_generators_._M_h._M_single_bucket,4,4);
  std::__cxx11::string::~string((string *)&context.tracked_generators_._M_h._M_single_bucket);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&context.tracked_generators_._M_h._M_single_bucket,"b",
             (allocator<char> *)auStack_48);
  var = kratos::Generator::var
                  (this_00,(string *)&context.tracked_generators_._M_h._M_single_bucket,2);
  std::__cxx11::string::~string((string *)&context.tracked_generators_._M_h._M_single_bucket);
  kratos::Simulator::Simulator
            ((Simulator *)&context.tracked_generators_._M_h._M_single_bucket,this_00);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 5;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = 1;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = 2;
  kratos::Simulator::set
            ((Simulator *)&context.tracked_generators_._M_h._M_single_bucket,var,oVar4,true);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)auStack_48,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &var->super_enable_shared_from_this<kratos::Var>);
  iVar1 = (*(pVVar2->super_IRNode)._vptr_IRNode[10])(pVVar2,auStack_48);
  value_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._4_4_ = 0;
  value_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_4_ =
       gtest_ar_.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl._4_4_;
  value_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = 1;
  kratos::Simulator::set
            ((Simulator *)&context.tracked_generators_._M_h._M_single_bucket,
             (Var *)CONCAT44(extraout_var,iVar1),value_00,true);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)auStack_48,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &var->super_enable_shared_from_this<kratos::Var>);
  iVar1 = (*(pVVar2->super_IRNode)._vptr_IRNode[10])(pVVar2,auStack_48);
  oVar4 = kratos::Simulator::get
                    ((Simulator *)&context.tracked_generators_._M_h._M_single_bucket,
                     (Var *)CONCAT44(extraout_var_00,iVar1));
  sim.simulation_depth_ =
       oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar);
  local_60.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_60.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,
                oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_engaged);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged == false) {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)auStack_48,(internal *)&local_60,(AssertionResult *)"res != std::nullopt",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x81,(char *)CONCAT71(stack0xffffffffffffffb9,auStack_48[0]));
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    std::__cxx11::string::~string((string *)auStack_48);
    if (local_28.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_28.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)auStack_48,"*res","value",&sim.simulation_depth_,
             (uint *)((long)&gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl + 4));
  if (auStack_48[0] == (allocator<char>)0x0) {
    testing::Message::Message(&local_60);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x82,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(local_60.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_60.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_60.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_60.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  iVar1 = (*(pVVar2->super_IRNode)._vptr_IRNode[9])(pVVar2,2);
  oVar4 = kratos::Simulator::get
                    ((Simulator *)&context.tracked_generators_._M_h._M_single_bucket,
                     (Var *)CONCAT44(extraout_var_01,iVar1));
  sim.simulation_depth_ =
       oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_60.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 5;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)auStack_48,"*res","5",&sim.simulation_depth_,(int *)&local_60);
  if (auStack_48[0] == (allocator<char>)0x0) {
    testing::Message::Message(&local_60);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x84,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(local_60.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_60.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_60.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_60.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  kratos::Simulator::~Simulator((Simulator *)&context.tracked_generators_._M_h._M_single_bucket);
  kratos::Context::~Context((Context *)local_340);
  return;
}

Assistant:

TEST(sim, array_access) {   // NOLINT
    Context context;
    auto &mod = context.generator("mod");
    auto &a = mod.var("a", 4, 4);
    auto &b = mod.var("b", 2);

    Simulator sim(&mod);
    uint32_t constexpr value = 5;
    sim.set(&b, 2ul);
    sim.set(&a[b.shared_from_this()], value);

    auto res = sim.get(&a[b.shared_from_this()]);
    EXPECT_TRUE(res != std::nullopt);
    EXPECT_EQ(*res, value);
    res = sim.get(&a[2]);
    EXPECT_EQ(*res, 5);
}